

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdFlag.c
# Opt level: O3

void Cmd_FlagDeleteByName(Abc_Frame_t *pAbc,char *key)

{
  int iVar1;
  char *local_10;
  char *local_8;
  
  if (key != (char *)0x0) {
    local_10 = key;
    iVar1 = st__delete(pAbc->tFlags,&local_10,&local_8);
    if (iVar1 != 0) {
      if (local_10 != (char *)0x0) {
        free(local_10);
        local_10 = (char *)0x0;
      }
      if (local_8 != (char *)0x0) {
        free(local_8);
      }
    }
  }
  return;
}

Assistant:

void Cmd_FlagDeleteByName( Abc_Frame_t * pAbc, const char * key )
{
    char *value;
    if ( !key )
        return;
    if ( st__delete( pAbc->tFlags, &key, &value ) ) 
    {
        ABC_FREE(key);
        ABC_FREE(value);
    }
}